

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O3

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
::
unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::ValueSymbol_const*,slang::IntervalMap<unsigned_long,std::monostate,3u>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::ValueSymbol_const*,void>,std::equal_to<slang::ast::ValueSymbol_const*>,slang::detail::hashing::StackAllocator<std::pair<slang::ast::ValueSymbol_const*const,slang::IntervalMap<unsigned_long,std::monostate,3u>>,288ul,16ul>>
          *this,size_t hash,try_emplace_args_t *args,ValueSymbol **args_1)

{
  allocator_type al;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  float fVar3;
  allocator_type sal;
  arrays_type new_arrays_;
  locator local_68;
  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  local_50;
  
  al.storage = *(Storage **)this;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(this + 0x30);
  auVar2._8_8_ = 0x41;
  auVar2._0_8_ = 0xc9714fbcda3ac11;
  fVar3 = ceilf((float)((SUB168(auVar1 * auVar2,8) >> 6) + 1) / 0.875);
  table_arrays<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  ::new_(&local_50,al,(long)(fVar3 - 9.223372e+18) & (long)fVar3 >> 0x3f | (long)fVar3);
  __return_storage_ptr__->pg = (group15<boost::unordered::detail::foa::plain_integral> *)0x0;
  __return_storage_ptr__->n = 0;
  __return_storage_ptr__->p =
       (pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
        *)0x0;
  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::ValueSymbol_const*>
            (&local_68,this,&local_50,hash >> ((byte)local_50.groups_size_index & 0x3f),hash,args,
             args_1);
  __return_storage_ptr__->p = local_68.p;
  __return_storage_ptr__->pg = local_68.pg;
  __return_storage_ptr__->n = local_68.n;
  *(undefined4 *)&__return_storage_ptr__->field_0xc = local_68._12_4_;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
  ::unchecked_rehash((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::ValueSymbol_*,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::ValueSymbol_*,_void>,_std::equal_to<const_slang::ast::ValueSymbol_*>,_slang::detail::hashing::StackAllocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>,_288UL,_16UL>_>
                      *)this,&local_50);
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  return __return_storage_ptr__;
}

Assistant:

BOOST_NOINLINE locator unchecked_emplace_with_rehash(std::size_t hash, Args&&... args) {
        auto new_arrays_ = new_arrays_for_growth();
        locator it;
        BOOST_TRY {
            /* strong exception guarantee -> try insertion before rehash */
            it = nosize_unchecked_emplace_at(new_arrays_, position_for(hash, new_arrays_), hash,
                                             std::forward<Args>(args)...);
        }